

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileData.h
# Opt level: O3

void __thiscall Assimp::Q3BSP::Q3BSPModel::~Q3BSPModel(Q3BSPModel *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer piVar4;
  pointer puVar5;
  bool bVar6;
  pointer ppsVar7;
  pointer ppsVar8;
  pointer ppsVar9;
  pointer ppsVar10;
  pointer ppsVar11;
  ulong uVar12;
  pointer ppsVar13;
  ulong uVar14;
  
  ppsVar7 = (this->m_Lumps).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Lumps).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppsVar7) {
    uVar12 = 0;
    uVar14 = 1;
    do {
      operator_delete(ppsVar7[uVar12],8);
      ppsVar7 = (this->m_Lumps).
                super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar14 < (ulong)((long)(this->m_Lumps).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar7 >> 3
                              );
      uVar12 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar6);
  }
  ppsVar8 = (this->m_Vertices).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Vertices).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar8) {
    uVar12 = 0;
    uVar14 = 1;
    do {
      operator_delete(ppsVar8[uVar12],0x2c);
      ppsVar8 = (this->m_Vertices).
                super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar14 < (ulong)((long)(this->m_Vertices).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar8 >> 3
                              );
      uVar12 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar6);
  }
  ppsVar9 = (this->m_Faces).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Faces).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppsVar9) {
    uVar12 = 0;
    uVar14 = 1;
    do {
      operator_delete(ppsVar9[uVar12],0x68);
      ppsVar9 = (this->m_Faces).
                super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar14 < (ulong)((long)(this->m_Faces).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar9 >> 3
                              );
      uVar12 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar6);
  }
  ppsVar10 = (this->m_Textures).
             super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Textures).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar10) {
    uVar12 = 0;
    uVar14 = 1;
    do {
      operator_delete(ppsVar10[uVar12],0x48);
      ppsVar10 = (this->m_Textures).
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar14 < (ulong)((long)(this->m_Textures).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar10 >>
                              3);
      uVar12 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar6);
  }
  ppsVar11 = (this->m_Lightmaps).
             super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppsVar13 = (this->m_Lightmaps).
             super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppsVar13 != ppsVar11) {
    uVar12 = 0;
    uVar14 = 1;
    do {
      operator_delete(ppsVar11[uVar12],0xc000);
      ppsVar11 = (this->m_Lightmaps).
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppsVar13 = (this->m_Lightmaps).
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      bVar6 = uVar14 < (ulong)((long)ppsVar13 - (long)ppsVar11 >> 3);
      uVar12 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar6);
  }
  ppsVar7 = (this->m_Lumps).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Lumps).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppsVar7) {
    (this->m_Lumps).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppsVar7;
  }
  ppsVar8 = (this->m_Vertices).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Vertices).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar8) {
    (this->m_Vertices).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppsVar8;
  }
  ppsVar9 = (this->m_Faces).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Faces).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppsVar9) {
    (this->m_Faces).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppsVar9;
  }
  ppsVar10 = (this->m_Textures).
             super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Textures).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar10) {
    (this->m_Textures).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppsVar10;
  }
  if (ppsVar13 != ppsVar11) {
    (this->m_Lightmaps).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppsVar11;
  }
  pcVar2 = (this->m_ModelName)._M_dataplus._M_p;
  paVar1 = &(this->m_ModelName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_EntityData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)(this->m_EntityData).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
  }
  ppsVar11 = (this->m_Lightmaps).
             super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar11 != (pointer)0x0) {
    operator_delete(ppsVar11,(long)(this->m_Lightmaps).
                                   super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppsVar11);
  }
  ppsVar10 = (this->m_Textures).
             super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar10 != (pointer)0x0) {
    operator_delete(ppsVar10,(long)(this->m_Textures).
                                   super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppsVar10);
  }
  piVar4 = (this->m_Indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)(this->m_Indices).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar4);
  }
  ppsVar9 = (this->m_Faces).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar9 != (pointer)0x0) {
    operator_delete(ppsVar9,(long)(this->m_Faces).
                                  super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppsVar9
                   );
  }
  ppsVar8 = (this->m_Vertices).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar8 != (pointer)0x0) {
    operator_delete(ppsVar8,(long)(this->m_Vertices).
                                  super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppsVar8
                   );
  }
  ppsVar7 = (this->m_Lumps).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar7 != (pointer)0x0) {
    operator_delete(ppsVar7,(long)(this->m_Lumps).
                                  super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppsVar7
                   );
  }
  puVar5 = (this->m_Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->m_Data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
    return;
  }
  return;
}

Assistant:

~Q3BSPModel() {
        for ( unsigned int i=0; i<m_Lumps.size(); i++ ) {
            delete m_Lumps[ i ];
        }
        for ( unsigned int i=0; i<m_Vertices.size(); i++ ) {
            delete m_Vertices[ i ];
        }
        for ( unsigned int i=0; i<m_Faces.size(); i++ ) {
            delete m_Faces[ i ];
        }
        for ( unsigned int i=0; i<m_Textures.size(); i++ ) {
            delete m_Textures[ i ];
        }
        for ( unsigned int i=0; i<m_Lightmaps.size(); i++ ) {
            delete m_Lightmaps[ i ];
        }

        m_Lumps.clear();
        m_Vertices.clear();
        m_Faces.clear();
        m_Textures.clear();
        m_Lightmaps.clear();
    }